

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeVertexArrayApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::vertex_attribf(NegativeTestContext *ctx)

{
  GLuint index;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_VALUE is generated if index is greater than or equal to GL_MAX_VERTEX_ATTRIBS."
             ,&local_39);
  NegativeTestContext::beginSection(ctx,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  index = NegativeTestContext::getInteger(ctx,0x8869);
  glu::CallLogWrapper::glVertexAttrib1f(&ctx->super_CallLogWrapper,index,0.0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glVertexAttrib2f(&ctx->super_CallLogWrapper,index,0.0,0.0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glVertexAttrib3f(&ctx->super_CallLogWrapper,index,0.0,0.0,0.0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glVertexAttrib4f(&ctx->super_CallLogWrapper,index,0.0,0.0,0.0,0.0);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void vertex_attribf (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_VALUE is generated if index is greater than or equal to GL_MAX_VERTEX_ATTRIBS.");
	int maxVertexAttribs = ctx.getInteger(GL_MAX_VERTEX_ATTRIBS);
	ctx.glVertexAttrib1f(maxVertexAttribs, 0.0f);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glVertexAttrib2f(maxVertexAttribs, 0.0f, 0.0f);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glVertexAttrib3f(maxVertexAttribs, 0.0f, 0.0f, 0.0f);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glVertexAttrib4f(maxVertexAttribs, 0.0f, 0.0f, 0.0f, 0.0f);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();
}